

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::freechunk(ImgfsFile *this,uint64_t ofs,uint size)

{
  element_type *peVar1;
  ulong __n;
  reference pvVar2;
  size_type sVar3;
  allocator<unsigned_char> local_3a;
  value_type_conflict2 local_39;
  undefined1 local_38 [8];
  ByteVector data;
  uint size_local;
  uint64_t ofs_local;
  ImgfsFile *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = size;
  markchunk(this,ofs,size,FREECHUNK);
  peVar1 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->_rd);
  (*peVar1->_vptr_ReadWriter[4])(peVar1,ofs);
  __n = (ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
  local_39 = 0xff;
  std::allocator<unsigned_char>::allocator(&local_3a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,__n,&local_39,
             &local_3a);
  std::allocator<unsigned_char>::~allocator(&local_3a);
  peVar1 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->_rd);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  (*peVar1->_vptr_ReadWriter[3])(peVar1,pvVar2,sVar3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void freechunk(uint64_t ofs, unsigned size)
    {
        markchunk(ofs, size, FREECHUNK);
        _rd->setpos(ofs);
        ByteVector data(size, 0xff);
        _rd->write(&data[0], data.size());
        //printf("freed chunk @ %08llx, size=%08x\n", ofs, size);
    }